

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getEdgesForRingsystem(RDL_data *data,uint idx,RDL_edge **edges)

{
  uint uVar1;
  RDL_graph *pRVar2;
  uint *puVar3;
  uint **ppuVar4;
  RDL_node *pRVar5;
  RDL_edge *paRVar6;
  ulong uVar7;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (idx < data->bccGraphs->nof_bcc) {
      paRVar6 = (RDL_edge *)malloc((ulong)data->bccGraphs->bcc_graphs[idx]->E << 3);
      *edges = paRVar6;
      pRVar2 = data->bccGraphs->bcc_graphs[idx];
      if (pRVar2->E == 0) {
        return 0;
      }
      puVar3 = data->bccGraphs->edge_from_bcc_mapping[idx];
      ppuVar4 = data->graph->edges;
      uVar7 = 0;
      do {
        pRVar5 = ppuVar4[puVar3[uVar7]];
        paRVar6[uVar7][0] = *pRVar5;
        paRVar6[uVar7][1] = pRVar5[1];
        uVar7 = uVar7 + 1;
        uVar1 = pRVar2->E;
      } while (uVar7 < uVar1);
      return uVar1;
    }
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n");
  }
  paRVar6 = (RDL_edge *)malloc(8);
  *edges = paRVar6;
  return 0xffffffff;
}

Assistant:

unsigned RDL_getEdgesForRingsystem(
    const RDL_data *data, unsigned idx, RDL_edge** edges)
{
  unsigned i, edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*edges) = malloc(sizeof(**edges));
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    (*edges) = malloc(sizeof(**edges));
    return RDL_INVALID_RESULT;
  }

  (*edges) = malloc(data->bccGraphs->bcc_graphs[idx]->E * sizeof(**edges));

  for (i = 0; i < data->bccGraphs->bcc_graphs[idx]->E; ++i) {
    edge = data->bccGraphs->edge_from_bcc_mapping[idx][i];
    (*edges)[i][0] = data->graph->edges[edge][0];
    (*edges)[i][1] = data->graph->edges[edge][1];
  }

  return data->bccGraphs->bcc_graphs[idx]->E;
}